

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_twod_orientation(REF_GRID ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  REF_BOOL valid;
  REF_INT nodes [27];
  int local_bc;
  REF_NODE local_b8;
  REF_BOOL *local_b0;
  REF_INT local_a8 [30];
  
  local_b8 = ref_grid->node;
  *allowed = 0;
  local_b0 = allowed;
  if (-1 < remove) {
    ref_cell = ref_grid->cell[3];
    pRVar1 = ref_cell->ref_adj;
    if ((remove < pRVar1->nnode) && (lVar9 = (long)pRVar1->first[(uint)remove], lVar9 != -1)) {
      uVar4 = ref_cell_nodes(ref_cell,pRVar1->item[lVar9].ref,local_a8);
      do {
        if (uVar4 != 0) {
          pcVar8 = "nodes";
          uVar7 = 0x428;
LAB_00179ca4:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,uVar7,"ref_collapse_edge_twod_orientation",(ulong)uVar4,pcVar8);
          return uVar4;
        }
        uVar5 = (ulong)ref_cell->node_per;
        if ((long)uVar5 < 1) {
LAB_00179cf3:
          uVar4 = ref_node_tri_twod_orientation(local_b8,local_a8,&local_bc);
          if (uVar4 != 0) {
            pcVar8 = "valid";
            uVar7 = 0x438;
            goto LAB_00179ca4;
          }
          if (local_bc == 0) {
            return 0;
          }
        }
        else {
          uVar6 = 0;
          bVar3 = false;
          do {
            if (local_a8[uVar6] == keep) {
              bVar3 = true;
            }
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
          if (!bVar3) {
            if (0 < ref_cell->node_per) {
              uVar6 = 0;
              do {
                if (local_a8[uVar6] == remove) {
                  local_a8[uVar6] = keep;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < uVar5);
            }
            goto LAB_00179cf3;
          }
        }
        pRVar2 = ref_cell->ref_adj->item;
        lVar9 = (long)pRVar2[(int)lVar9].next;
        if (lVar9 == -1) break;
        uVar4 = ref_cell_nodes(ref_cell,pRVar2[lVar9].ref,local_a8);
      } while( true );
    }
  }
  *local_b0 = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_twod_orientation(REF_GRID ref_grid,
                                                      REF_INT keep,
                                                      REF_INT remove,
                                                      REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed, valid;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (keep == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (remove == nodes[node]) {
        nodes[node] = keep;
      }
    }

    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}